

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

BOOL Js::RegexHelper::RegexTest_NonScript<true>
               (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,char16 *input,
               CharCount inputLength)

{
  GroupInfo GVar1;
  bool local_49;
  CharCount offset;
  bool isSticky;
  Type TStack_34;
  bool isGlobal;
  GroupInfo match;
  RegexPattern *pattern;
  CharCount inputLength_local;
  char16 *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  
  match = (GroupInfo)JavascriptRegExp::GetPattern(regularExpression);
  UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)&offset);
  RegexHelperTrace(scriptContext,Test,regularExpression,input,inputLength,(char16 *)0x0,0);
  UnifiedRegex::RegexPattern::IsGlobal((RegexPattern *)match);
  UnifiedRegex::RegexPattern::IsSticky((RegexPattern *)match);
  GVar1 = SimpleMatch(scriptContext,(RegexPattern *)match,input,inputLength,0);
  offset = GVar1.offset;
  local_49 = false;
  if (offset == 0) {
    TStack_34 = GVar1.length;
    local_49 = TStack_34 == inputLength;
  }
  return (BOOL)local_49;
}

Assistant:

BOOL RegexHelper::RegexTest_NonScript(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, const char16 *const input, const CharCount inputLength)
    {
        // This version of the function should only be used when testing the regex against a non-javascript string. That is,
        // this call was not initiated by script code. Hence, the RegExp constructor is not updated with the last match. If
        // 'mustMatchEntireInput' is true, this function also ignores the global/sticky flag and the lastIndex property, since it tests
        // for a match on the entire input string; in that case, the lastIndex property is not modified.

        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        UnifiedRegex::GroupInfo match; // initially undefined

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Test, regularExpression, input, inputLength);
#endif
        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        CharCount offset;
        if (mustMatchEntireInput)
            offset = 0; // needs to match the entire input, so ignore 'lastIndex' and always start from the beginning
        else if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
            return false;

        if (mustMatchEntireInput || offset <= inputLength)
        {
            match = RegexHelper::SimpleMatch(scriptContext, pattern, input, inputLength, offset);
        }
        // else: match remains undefined

        if (!mustMatchEntireInput) // don't update 'lastIndex' when mustMatchEntireInput is true since the global flag is ignored
        {
            PropagateLastMatchToRegex(scriptContext, isGlobal, isSticky, regularExpression, match, match);
        }

        return mustMatchEntireInput ? match.offset == 0 && match.length == inputLength : !match.IsUndefined();
    }